

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O0

bool __thiscall pm::Rectangle::shadowHit(Rectangle *this,Ray *ray,float *tMin)

{
  float fVar1;
  float fVar2;
  float dDotB;
  float dDotA;
  Vector3 d;
  undefined1 local_44 [8];
  Vector3 p;
  float t;
  float *tMin_local;
  Ray *ray_local;
  Rectangle *this_local;
  
  if (((this->super_Geometry).castShadows_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    Vector3::operator-((Vector3 *)&p.y,&this->point_);
    fVar1 = dot((Vector3 *)&p.y,&this->normal_);
    fVar2 = dot(&ray->d,&this->normal_);
    fVar1 = fVar1 / fVar2;
    if (1e-09 < fVar1) {
      operator*((pm *)&d.y,fVar1,&ray->d);
      Vector3::operator+((Vector3 *)local_44,&ray->o);
      Vector3::operator-((Vector3 *)&dDotB,(Vector3 *)local_44);
      fVar2 = dot((Vector3 *)&dDotB,&this->a_);
      if ((fVar2 < 0.0) || (this->aSquaredLength_ <= fVar2 && fVar2 != this->aSquaredLength_)) {
        this_local._7_1_ = false;
      }
      else {
        fVar2 = dot((Vector3 *)&dDotB,&this->b_);
        if ((fVar2 < 0.0) || (this->bSquaredLength_ <= fVar2 && fVar2 != this->bSquaredLength_)) {
          this_local._7_1_ = false;
        }
        else {
          *tMin = fVar1;
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Rectangle::shadowHit(const Ray &ray, float &tMin) const
{
	if (castShadows_ == false)
		return false;

	float t = dot((point_ - ray.o), normal_) / dot(ray.d, normal_);

	if (t <= Epsilon)
		return false;

	Vector3 p = ray.o + t * ray.d;
	Vector3 d = p - point_;

	const float dDotA = dot(d, a_);
	if (dDotA < 0.0f || dDotA > aSquaredLength_)
		return false;

	const float dDotB = dot(d, b_);
	if (dDotB < 0.0f || dDotB > bSquaredLength_)
		return false;

	tMin = t;

	return true;
}